

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LU.hpp
# Opt level: O0

bool OpenMD::invertMatrix<OpenMD::SquareMatrix<double,6>>
               (SquareMatrix<double,_6> *A,SquareMatrix<double,_6> *AI)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined1 *puVar8;
  ulong uVar9;
  double *tmp2Size;
  RectMatrix<double,_6U,_6U> *in_RSI;
  RectMatrix<double,_6U,_6U> *in_RDI;
  bool retVal;
  Real *column;
  Real dScratch [10];
  int *index;
  int iScratch [10];
  int size;
  int *in_stack_ffffffffffffff10;
  undefined2 in_stack_ffffffffffffff2c;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 uVar10;
  double local_b8 [10];
  undefined1 local_61;
  int *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 local_48 [44];
  uint local_1c;
  RectMatrix<double,_6U,_6U> *local_18;
  RectMatrix<double,_6U,_6U> *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  uVar4 = RectMatrix<double,_6U,_6U>::getNRow(in_RDI);
  uVar5 = RectMatrix<double,_6U,_6U>::getNCol(local_10);
  if (uVar4 == uVar5) {
    uVar5 = RectMatrix<double,_6U,_6U>::getNRow(local_10);
    uVar6 = RectMatrix<double,_6U,_6U>::getNRow(local_18);
    if (uVar5 == uVar6) {
      uVar6 = RectMatrix<double,_6U,_6U>::getNCol(local_10);
      uVar7 = RectMatrix<double,_6U,_6U>::getNCol(local_18);
      if (uVar6 == uVar7) {
        local_1c = RectMatrix<double,_6U,_6U>::getNRow(local_10);
        local_61 = 0;
        if ((int)local_1c < 0xb) {
          puVar8 = local_48;
        }
        else {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = (long)(int)local_1c;
          in_stack_ffffffffffffff10 = SUB168(auVar1 * ZEXT816(4),0);
          if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
            in_stack_ffffffffffffff10 = (int *)0xffffffffffffffff;
          }
          puVar8 = (undefined1 *)operator_new__((ulong)in_stack_ffffffffffffff10);
          local_61 = 1;
          local_60 = in_stack_ffffffffffffff10;
          local_58 = puVar8;
        }
        uVar10 = 0;
        local_50 = puVar8;
        if ((int)local_1c < 0xb) {
          tmp2Size = local_b8;
        }
        else {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = (long)(int)local_1c;
          uVar9 = SUB168(auVar2 * ZEXT816(8),0);
          if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
            uVar9 = 0xffffffffffffffff;
          }
          tmp2Size = (double *)operator_new__(uVar9);
          uVar10 = 1;
        }
        bVar3 = invertMatrix<OpenMD::SquareMatrix<double,6>>
                          ((SquareMatrix<double,_6> *)
                           CONCAT17(uVar10,CONCAT16(in_stack_ffffffffffffff2e,
                                                    CONCAT24(in_stack_ffffffffffffff2c,uVar4))),
                           (SquareMatrix<double,_6> *)CONCAT44(uVar5,uVar6),
                           (uint)((ulong)puVar8 >> 0x20),in_stack_ffffffffffffff10,tmp2Size);
        if (10 < (int)local_1c) {
          if (local_50 != (undefined1 *)0x0) {
            operator_delete__(local_50);
          }
          if (tmp2Size != (ElemPoinerType)0x0) {
            operator_delete__(tmp2Size);
          }
        }
        return (bool)(bVar3 & 1);
      }
    }
  }
  return false;
}

Assistant:

bool invertMatrix(MatrixType& A, MatrixType& AI) {
    using Real = typename MatrixType::ElemType;

    if (A.getNRow() != A.getNCol() || A.getNRow() != AI.getNRow() ||
        A.getNCol() != AI.getNCol()) {
      return false;
    }

    int size = A.getNRow();

    // Check on allocation of working vectors
    //
    int iScratch[MAX_SCRATCH_ARRAY_SIZE];
    int* index = (size <= MAX_SCRATCH_ARRAY_SIZE ? iScratch : new int[size]);
    Real dScratch[MAX_SCRATCH_ARRAY_SIZE];
    Real* column = (size <= MAX_SCRATCH_ARRAY_SIZE ? dScratch : new Real[size]);

    bool retVal = invertMatrix(A, AI, size, index, column);

    if (size > MAX_SCRATCH_ARRAY_SIZE) {
      delete[] index;
      delete[] column;
    }
    return retVal;
  }